

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::end_positive_value
          (basic_json_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  unsigned_long *in_RCX;
  type tVar1;
  uint64_t val;
  undefined8 local_30;
  size_type local_28;
  pointer local_20;
  
  tVar1 = detail::to_integer_unchecked<unsigned_long,char>
                    ((detail *)(this->string_buffer_)._M_dataplus._M_p,
                     (char *)(this->string_buffer_)._M_string_length,(size_t)&local_30,in_RCX);
  if (tVar1.ec == success) {
    (*visitor->_vptr_basic_json_visitor[0xf])(visitor,local_30,0,this,ec);
  }
  else {
    local_20 = (this->string_buffer_)._M_dataplus._M_p;
    local_28 = (this->string_buffer_)._M_string_length;
    (*visitor->_vptr_basic_json_visitor[0xc])(visitor,&local_28,2,this,ec);
  }
  this->more_ = (bool)(this->cursor_mode_ ^ 1);
  after_value(this,ec);
  return;
}

Assistant:

void end_positive_value(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        uint64_t val;
        auto result = jsoncons::detail::to_integer_unchecked(string_buffer_.data(), string_buffer_.length(), val);
        if (result)
        {
            visitor.uint64_value(val, semantic_tag::none, *this, ec);
            more_ = !cursor_mode_;
        }
        else // Must be overflow
        {
            visitor.string_value(string_buffer_, semantic_tag::bigint, *this, ec);
            more_ = !cursor_mode_;
        }
        after_value(ec);
    }